

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::record::InterpolationBase::print<std::back_insert_iterator<std::__cxx11::string>>
          (InterpolationBase *this,
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,int MAT,int MF,int MT)

{
  undefined1 auVar1 [16];
  long lVar2;
  pointer value;
  long lVar3;
  long lVar4;
  pointer plVar5;
  bool bVar6;
  int MT_local;
  int MF_local;
  int MAT_local;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  double local_40;
  double local_38;
  
  local_38 = (this->metadata).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Head_base<0UL,_double,_false>._M_head_impl;
  local_40 = (this->metadata).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
             super__Head_base<1UL,_double,_false>._M_head_impl;
  local_48 = (this->metadata).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
             super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
             _M_head_impl;
  local_50 = (this->metadata).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
             super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>
             .super__Head_base<3UL,_long,_false>._M_head_impl;
  plVar5 = (this->boundaryIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_58 = (long)plVar5 -
             (long)(this->boundaryIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
  local_60 = plVar5[-1];
  MT_local = MT;
  MF_local = MF;
  MAT_local = MAT;
  tools::disco::
  Record<njoy::tools::disco::ENDF,njoy::tools::disco::ENDF,njoy::tools::disco::Integer<11u>,njoy::tools::disco::Integer<11u>,njoy::tools::disco::Integer<11u>,njoy::tools::disco::Integer<11u>,njoy::tools::disco::Integer<4u>,njoy::tools::disco::Integer<2u>,njoy::tools::disco::Integer<3u>,njoy::tools::disco::Column<5u>>
  ::
  write<std::back_insert_iterator<std::__cxx11::string>,double,double,long,long,long,long,int,int,int>
            (it,&local_38,&local_40,&local_48,&local_50,&local_58,&local_60,&MAT_local,&MF_local,
             &MT_local);
  plVar5 = (this->boundaryIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = (long)(this->boundaryIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)plVar5;
  lVar4 = lVar3 >> 3;
  auVar1._8_8_ = lVar3 >> 0x3f;
  auVar1._0_8_ = lVar4;
  lVar3 = SUB168(auVar1 / SEXT816(3),0);
  lVar2 = lVar3 * -3;
  value = (this->interpolationSchemeIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl
          .super__Vector_impl_data._M_start;
  local_68 = lVar3;
  while (bVar6 = lVar3 != 0, lVar3 = lVar3 + -1, bVar6) {
    tools::disco::
    Record<njoy::tools::disco::Integer<11u>,njoy::tools::disco::Integer<11u>,njoy::tools::disco::Integer<11u>,njoy::tools::disco::Integer<11u>,njoy::tools::disco::Integer<11u>,njoy::tools::disco::Integer<11u>,njoy::tools::disco::Integer<4u>,njoy::tools::disco::Integer<2u>,njoy::tools::disco::Integer<3u>,njoy::tools::disco::Column<5u>>
    ::
    write<std::back_insert_iterator<std::__cxx11::string>,long,long,long,long,long,long,int,int,int>
              (it,plVar5,value,plVar5 + 1,value + 1,plVar5 + 2,value + 2,&MAT_local,&MF_local,
               &MT_local);
    plVar5 = plVar5 + 3;
    value = value + 3;
  }
  lVar2 = lVar2 + lVar4;
  if (lVar2 != 0) {
    while (bVar6 = lVar2 != 0, lVar2 = lVar2 + -1, bVar6) {
      tools::disco::Integer<11u>::write<long,std::back_insert_iterator<std::__cxx11::string>>
                (plVar5,it);
      tools::disco::Integer<11u>::write<long,std::back_insert_iterator<std::__cxx11::string>>
                (value,it);
      plVar5 = plVar5 + 1;
      value = value + 1;
    }
    for (lVar3 = lVar4 * 2 + local_68 * -6 + -6; lVar3 != 0; lVar3 = lVar3 + 1) {
      tools::disco::Column<11u>::write<std::back_insert_iterator<std::__cxx11::string>>(it);
    }
    tools::disco::
    Record<njoy::tools::disco::Integer<4u>,njoy::tools::disco::Integer<2u>,njoy::tools::disco::Integer<3u>,njoy::tools::disco::Column<5u>>
    ::write<std::back_insert_iterator<std::__cxx11::string>,int,int,int>
              (it,&MAT_local,&MF_local,&MT_local);
  }
  return;
}

Assistant:

void print( OutputIterator& it, int MAT, int MF, int MT ) const {

  using namespace njoy::tools;

  {
    using Format = disco::Record< disco::ENDF, disco::ENDF,
                                  disco::Integer< 11 >, disco::Integer< 11 >,
                                  disco::Integer< 11 >, disco::Integer< 11 >,
                                  disco::Integer< 4 >, disco::Integer< 2 >,
                                  disco::Integer< 3 >, disco::Column< 5 > >;
    Format::write( it,
                   this->C1(), this->C2(),
                   this->L1(), this->L2(),
                   this->NR(), this->N2(),
                   MAT, MF, MT );
  }
  {
    using Format = disco::Record< disco::Integer< 11 >, disco::Integer< 11 >,
                                  disco::Integer< 11 >, disco::Integer< 11 >,
                                  disco::Integer< 11 >, disco::Integer< 11 >,
                                  disco::Integer< 4 >, disco::Integer< 2 >,
                                  disco::Integer< 3 >, disco::Column< 5 > >;

    auto nFullLines = this->NR() / 3;
    auto partialLineEntries = this->NR() - nFullLines * 3;

    auto boundary = this->boundaries().begin();
    auto interpolant = this->interpolants().begin();

    while ( nFullLines-- ){
      Format::write( it,
                     boundary[0], interpolant[0],
                     boundary[1], interpolant[1],
                     boundary[2], interpolant[2],
                     MAT, MF, MT );
      boundary += 3; interpolant += 3;
    }

    if ( partialLineEntries ){
      auto blankEntries = 2 * ( 3 - partialLineEntries );
      while ( partialLineEntries-- ){
        disco::Integer<11>::write( *boundary, it );
        disco::Integer<11>::write( *interpolant, it );
        ++boundary; ++interpolant;
      }

      while ( blankEntries-- ){ disco::Column< 11 >::write( it ); }

      using Format =
        disco::Record< disco::Integer< 4 >, disco::Integer< 2 >,
                       disco::Integer< 3 >, disco::Column< 5 > >;

      Format::write( it, MAT, MF, MT );
    }
  }
}